

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O1

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  undefined4 uVar1;
  VersionEdit *pVVar2;
  bool bVar3;
  undefined8 *in_RDX;
  char *__s;
  uint32_t tag;
  uint32_t v;
  Status *result;
  Slice str;
  uint64_t number;
  FileMetaData f;
  InternalKey key;
  Slice input;
  uint32_t local_18c;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined1 local_170 [24];
  char local_158 [16];
  _Alloc_hider local_148;
  char local_138 [16];
  Slice *local_128;
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
  *local_120;
  Slice *local_118;
  VersionEdit *local_110;
  Slice *local_108;
  size_t *local_100;
  Slice *local_f8;
  size_t *local_f0;
  Slice local_e8;
  pointer local_d8;
  pointer local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  uint64_t local_c0;
  InternalKey local_b8;
  InternalKey local_98;
  InternalKey local_78;
  Slice local_58;
  _Alloc_hider local_48;
  Slice local_40;
  
  local_110 = this;
  Clear((VersionEdit *)src);
  local_58.data_ = (char *)*in_RDX;
  local_58.size_ = in_RDX[1];
  local_d0 = (pointer)0x4000000000000000;
  local_c0 = 0;
  local_b8.rep_._M_dataplus._M_p = (pointer)&local_b8.rep_.field_2;
  local_b8.rep_._M_string_length = 0;
  local_b8.rep_.field_2._M_local_buf[0] = '\0';
  local_98.rep_._M_dataplus._M_p = (pointer)&local_98.rep_.field_2;
  local_98.rep_._M_string_length = 0;
  local_98.rep_.field_2._M_local_buf[0] = '\0';
  local_e8.data_ = "";
  local_e8.size_ = 0;
  local_78.rep_._M_dataplus._M_p = (pointer)&local_78.rep_.field_2;
  local_78.rep_._M_string_length = 0;
  local_78.rep_.field_2._M_local_buf[0] = '\0';
  local_128 = src + 9;
  local_118 = src + 6;
  local_120 = (vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
               *)&src[4].size_;
  local_f0 = &src[3].size_;
  local_f8 = src + 3;
  local_100 = &src[2].size_;
  local_108 = src + 2;
  do {
    __s = "unknown tag";
    bVar3 = GetVarint32(&local_58,&local_18c);
    if (!bVar3) {
      __s = "invalid tag";
      if (local_58.size_ == 0) {
        __s = (char *)0x0;
      }
      break;
    }
    bVar3 = false;
    switch(local_18c) {
    case 1:
      bVar3 = GetLengthPrefixedSlice(&local_58,&local_e8);
      if (bVar3) {
        local_188 = (undefined1  [8])&uStack_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,local_e8.data_,local_e8.data_ + local_e8.size_);
        std::__cxx11::string::operator=((string *)src,(string *)local_188);
        if (local_188 != (undefined1  [8])&uStack_178) {
          operator_delete((void *)local_188);
        }
        *(undefined1 *)&src[4].data_ = 1;
        bVar3 = true;
        __s = (char *)0x0;
      }
      else {
        bVar3 = false;
        __s = "comparator name";
      }
      break;
    case 2:
      bVar3 = GetVarint64(&local_58,(uint64_t *)local_108);
      if (bVar3) {
        *(undefined1 *)((long)&src[4].data_ + 1) = 1;
LAB_001136b7:
        bVar3 = true;
        __s = (char *)0x0;
      }
      else {
        bVar3 = false;
        __s = "log number";
      }
      break;
    case 3:
      bVar3 = GetVarint64(&local_58,(uint64_t *)local_f8);
      if (bVar3) {
        *(undefined1 *)((long)&src[4].data_ + 3) = 1;
        goto LAB_001136b7;
      }
      bVar3 = false;
      __s = "next file number";
      break;
    case 4:
      bVar3 = GetVarint64(&local_58,local_f0);
      if (bVar3) {
        *(undefined1 *)((long)&src[4].data_ + 4) = 1;
        goto LAB_001136b7;
      }
      bVar3 = false;
      __s = "last sequence number";
      break;
    case 5:
      bVar3 = GetVarint32(&local_58,(uint32_t *)local_188);
      uVar1 = local_188._0_4_;
      if (((uint)local_188._0_4_ < 7 && bVar3) &&
         (bVar3 = GetInternalKey(&local_58,&local_78), bVar3)) {
        local_188 = (undefined1  [8])CONCAT44(local_188._4_4_,uVar1);
        local_180._M_p = local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_78.rep_._M_dataplus._M_p,
                   local_78.rep_._M_dataplus._M_p + local_78.rep_._M_string_length);
        std::
        vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
        ::emplace_back<std::pair<int,leveldb::InternalKey>>
                  (local_120,(pair<int,_leveldb::InternalKey> *)local_188);
        if (local_180._M_p != local_170) {
          operator_delete(local_180._M_p);
        }
        bVar3 = true;
        __s = (char *)0x0;
      }
      else {
        bVar3 = false;
        __s = "compaction pointer";
      }
      break;
    case 6:
      bVar3 = GetVarint32(&local_58,(uint32_t *)local_188);
      uVar1 = local_188._0_4_;
      if (((uint)local_188._0_4_ < 7 && bVar3) &&
         (bVar3 = GetVarint64(&local_58,(uint64_t *)&local_d8), bVar3)) {
        local_188 = (undefined1  [8])CONCAT44(local_188._4_4_,uVar1);
        local_180._M_p = local_d8;
        std::
        _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
        ::_M_insert_unique<std::pair<int,unsigned_long>>
                  ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                    *)local_118,(pair<int,_unsigned_long> *)local_188);
        goto LAB_001136b7;
      }
      bVar3 = false;
      __s = "deleted file";
      break;
    case 7:
      bVar3 = GetVarint32(&local_58,(uint32_t *)local_188);
      uVar1 = local_188._0_4_;
      if (((((uint)local_188._0_4_ < 7 && bVar3) &&
           (bVar3 = GetVarint64(&local_58,(uint64_t *)&uStack_c8), bVar3)) &&
          (bVar3 = GetVarint64(&local_58,&local_c0), bVar3)) &&
         ((bVar3 = GetInternalKey(&local_58,&local_b8), bVar3 &&
          (bVar3 = GetInternalKey(&local_58,&local_98), bVar3)))) {
        local_188 = (undefined1  [8])CONCAT44(local_188._4_4_,uVar1);
        local_170._0_8_ = local_c0;
        local_180._M_p = local_d0;
        uStack_178 = uStack_c8;
        uStack_174 = uStack_c4;
        local_170._8_8_ = local_158;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_170 + 8),local_b8.rep_._M_dataplus._M_p,
                   local_b8.rep_._M_dataplus._M_p + local_b8.rep_._M_string_length);
        local_148._M_p = local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_98.rep_._M_dataplus._M_p,
                   local_98.rep_._M_dataplus._M_p + local_98.rep_._M_string_length);
        std::
        vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
        ::emplace_back<std::pair<int,leveldb::FileMetaData>>
                  ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                    *)local_128,(pair<int,_leveldb::FileMetaData> *)local_188);
        if (local_148._M_p != local_138) {
          operator_delete(local_148._M_p);
        }
        if ((char *)local_170._8_8_ != local_158) {
          operator_delete((void *)local_170._8_8_);
        }
        goto LAB_001136b7;
      }
      bVar3 = false;
      __s = "new-file entry";
      break;
    default:
      break;
    case 9:
      bVar3 = GetVarint64(&local_58,local_100);
      if (bVar3) {
        *(undefined1 *)((long)&src[4].data_ + 2) = 1;
        goto LAB_001136b7;
      }
      bVar3 = false;
      __s = "previous log number";
    }
  } while (bVar3);
  pVVar2 = local_110;
  (local_110->comparator_)._M_dataplus._M_p = (pointer)0x0;
  if (__s != (char *)0x0) {
    local_188 = (undefined1  [8])0x1261f5;
    local_180._M_p = (pointer)0xb;
    local_40.data_ = __s;
    local_40.size_ = strlen(__s);
    Status::Status((Status *)&local_48,kCorruption,(Slice *)local_188,&local_40);
    (pVVar2->comparator_)._M_dataplus._M_p = local_48._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.rep_._M_dataplus._M_p != &local_78.rep_.field_2) {
    operator_delete(local_78.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.rep_._M_dataplus._M_p != &local_98.rep_.field_2) {
    operator_delete(local_98.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.rep_._M_dataplus._M_p != &local_b8.rep_.field_2) {
    operator_delete(local_b8.rep_._M_dataplus._M_p);
  }
  return (Status)(char *)pVVar2;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}